

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O0

void __thiscall slang::SVInt::setAllZ(SVInt *this)

{
  bool bVar1;
  uint32_t uVar2;
  uint64_t *puVar3;
  SVInt *in_RDI;
  SVInt *in_stack_00000010;
  uint32_t i;
  uint local_c;
  
  if (((in_RDI->super_SVIntStorage).unknownFlag & 1U) == 0) {
    bVar1 = isSingleWord(in_RDI);
    if ((!bVar1) && ((in_RDI->super_SVIntStorage).field_0.val != 0)) {
      operator_delete__((void *)0x298294);
    }
    (in_RDI->super_SVIntStorage).unknownFlag = true;
    getNumWords((SVInt *)0x2982a4);
    puVar3 = (uint64_t *)operator_new__(0x2982c7);
    (in_RDI->super_SVIntStorage).field_0.pVal = puVar3;
  }
  for (local_c = 0; uVar2 = getNumWords((SVInt *)0x2982ec), local_c < uVar2; local_c = local_c + 1)
  {
    (in_RDI->super_SVIntStorage).field_0.pVal[local_c] = 0xffffffffffffffff;
  }
  clearUnusedBits(in_stack_00000010);
  return;
}

Assistant:

void SVInt::setAllZ() {
    if (!unknownFlag) {
        if (!isSingleWord())
            delete[] pVal;

        unknownFlag = true;
        pVal = new uint64_t[getNumWords()];
    }

    // everything set to 1 (for Z in the low half and for unknown in the upper half)
    for (uint32_t i = 0; i < getNumWords(); i++)
        pVal[i] = UINT64_MAX;
    clearUnusedBits();
}